

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::aux::split_string
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,aux *this,string_view last,char sep)

{
  aux *paVar1;
  void *pvVar2;
  long lVar3;
  aux *paVar4;
  aux *__s;
  size_type __n;
  
  __s = (aux *)last._M_len;
  if (this == (aux *)0x0) {
    paVar4 = (aux *)0xffffffffffffffff;
  }
  else {
    pvVar2 = memchr(__s,(int)(char)last._M_str,(size_t)this);
    paVar4 = (aux *)(-(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s);
  }
  if (paVar4 == (aux *)0xffffffffffffffff) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = (size_t)this;
    lVar3 = 8;
  }
  else {
    paVar1 = paVar4 + 1;
    if (this <= paVar4) {
      ::std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 paVar1,this);
    }
    (__return_storage_ptr__->first)._M_len = (size_t)paVar4;
    (__return_storage_ptr__->first)._M_str = (char *)__s;
    (__return_storage_ptr__->second)._M_len = (long)this - (long)paVar1;
    lVar3 = 0x18;
    __s = paVar1 + (long)__s;
  }
  *(aux **)((long)&(__return_storage_ptr__->first)._M_len + lVar3) = __s;
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> split_string(string_view last, char const sep)
	{
		auto const pos = last.find(sep);
		if (pos == string_view::npos) return {last, {}};
		else return {last.substr(0, pos), last.substr(pos + 1)};
	}